

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseMaps.h
# Opt level: O2

insert_result __thiscall
tonk::
LightHashMap<asio::ip::basic_endpoint<asio::ip::udp>,_tonk::IConnection_*,_tonk::UDPAddressHasher>::
insert(LightHashMap<asio::ip::basic_endpoint<asio::ip::udp>,_tonk::IConnection_*,_tonk::UDPAddressHasher>
       *this,basic_endpoint<asio::ip::udp> *k,IConnection **v)

{
  uint uVar1;
  insert_result iVar2;
  bool bVar3;
  uint new_hash_size;
  insert_result result;
  
  result.first = 0;
  result._4_4_ = result._4_4_ & 0xffffff00;
  bVar3 = insert_no_grow(this,&result,k,v);
  if (!bVar3) {
    uVar1 = this->m_values_count * 2;
    new_hash_size = 4;
    if (4 < uVar1) {
      new_hash_size = uVar1;
    }
    rehash(this,new_hash_size);
    insert_no_grow(this,&result,k,v);
  }
  iVar2.second = result.second;
  iVar2._5_3_ = result._5_3_;
  iVar2.first = result.first;
  return iVar2;
}

Assistant:

inline insert_result insert(const Key& k, const Value& v = Value())
    {
        insert_result result;
        if (!insert_no_grow(result, k, v))
        {
            unsigned newSize = m_values_count * 2;
            if (newSize < cMinHashSize) {
                newSize = cMinHashSize;
            }

            rehash(newSize);

            if (!insert_no_grow(result, k, v)) {
                TONK_DEBUG_BREAK();
            }
        }

        return result;
    }